

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Ucs2ComputeLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  uint uVar1;
  Col_StringFormat CVar2;
  uint *data;
  bool bVar3;
  
  if (chunks->format - COL_UCS1 < 2) {
    *(size_t *)clientData = *clientData + length;
  }
  else {
    data = (uint *)chunks->data;
    while (bVar3 = length != 0, length = length - 1, bVar3) {
      CVar2 = chunks->format;
      if (CVar2 - COL_UCS1 < 2) {
LAB_00109088:
        *(long *)clientData = *clientData + 1;
LAB_0010908b:
        CVar2 = chunks->format;
      }
      else {
        if (CVar2 == COL_UTF16) {
          uVar1 = Col_Utf16Get((Col_Char2 *)data);
LAB_00109081:
          if (uVar1 < 0x10000) goto LAB_00109088;
          goto LAB_0010908b;
        }
        if (CVar2 == COL_UTF8) {
          uVar1 = Col_Utf8Get((Col_Char1 *)data);
          goto LAB_00109081;
        }
        if (CVar2 == COL_UCS4) {
          uVar1 = *data;
          goto LAB_00109081;
        }
      }
      if (CVar2 == COL_UCS1) {
        data = (uint *)((long)data + 1);
      }
      else if (CVar2 == COL_UCS2) {
        data = (uint *)((long)data + 2);
      }
      else if (CVar2 == COL_UCS4) {
        data = data + 1;
      }
      else if (CVar2 == COL_UTF8) {
        data = (uint *)Col_Utf8Next((Col_Char1 *)data);
      }
      else if (CVar2 == COL_UTF16) {
        data = (uint *)Col_Utf16Next((Col_Char2 *)data);
      }
      else {
        data = (uint *)0x0;
      }
    }
  }
  return 0;
}

Assistant:

static int
Ucs2ComputeLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *lengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    if (chunks->format == COL_UCS1 || chunks->format == COL_UCS2) {
        *lengthPtr += length;
        return 0;
    }
    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c <= COL_CHAR2_MAX) (*lengthPtr)++;
    }
    return 0;
}